

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::ProgramPipelineBindingCase::iterate
          (ProgramPipelineBindingCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestLog *pTVar3;
  int iVar4;
  GLenum GVar5;
  undefined4 extraout_var;
  long *plVar6;
  size_type *psVar7;
  ulong uVar8;
  undefined8 uVar9;
  ScopedLogSection section;
  ScopedLogSection section_1;
  CallLogWrapper gl;
  ProgramPipeline pipeline;
  ScopedLogSection section_2;
  ResultCollector result;
  string local_158;
  string local_138;
  ScopedLogSection local_118;
  long local_110;
  TestLog local_108;
  long lStack_100;
  ScopedLogSection local_f8;
  string local_f0;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  CallLogWrapper local_b0;
  ProgramPipeline local_98;
  ScopedLogSection local_88;
  GLenum local_80;
  ResultCollector local_78;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_b0,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar1 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_78,pTVar3,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_b0.m_enableLog = true;
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Initial","");
  paVar2 = &local_138.field_2;
  local_138._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Initial value","");
  tcu::ScopedLogSection::ScopedLogSection(&local_118,pTVar3,&local_158,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  deqp::gls::StateQueryUtil::verifyStateInteger(&local_78,&local_b0,0x825a,0,this->m_verifierType);
  tcu::TestLog::endSection(local_118.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"AfterBinding","");
  local_138._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"After binding","");
  tcu::ScopedLogSection::ScopedLogSection(&local_f8,pTVar3,&local_158,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  glu::ProgramPipeline::ProgramPipeline(&local_98,((this->super_TestCase).m_context)->m_renderCtx);
  glu::CallLogWrapper::glBindProgramPipeline(&local_b0,local_98.m_pipeline);
  GVar5 = glu::CallLogWrapper::glGetError(&local_b0);
  if (GVar5 != 0) {
    local_d0 = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Got Error ","");
    local_88.m_log = (TestLog *)glu::getErrorName;
    local_80 = GVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_f0,&local_88);
    uVar8 = 0xf;
    if (local_d0 != local_c0) {
      uVar8 = local_c0[0];
    }
    if (uVar8 < local_f0._M_string_length + local_c8) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        uVar9 = local_f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_f0._M_string_length + local_c8) goto LAB_015058bd;
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_d0)
      ;
    }
    else {
LAB_015058bd:
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_d0,(ulong)local_f0._M_dataplus._M_p);
    }
    local_118.m_log = &local_108;
    pTVar3 = (TestLog *)(plVar6 + 2);
    if ((TestLog *)*plVar6 == pTVar3) {
      local_108.m_log = pTVar3->m_log;
      lStack_100 = plVar6[3];
    }
    else {
      local_108.m_log = pTVar3->m_log;
      local_118.m_log = (TestLog *)*plVar6;
    }
    local_110 = plVar6[1];
    *plVar6 = (long)pTVar3;
    plVar6[1] = 0;
    *(undefined1 *)&pTVar3->m_log = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_138.field_2._M_allocated_capacity = *psVar7;
      local_138.field_2._8_8_ = plVar6[3];
      local_138._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar7;
      local_138._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_138._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_158.field_2._M_allocated_capacity = *psVar7;
      local_158.field_2._8_8_ = plVar6[3];
      local_158._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar7;
      local_158._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_158._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_78,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if (local_118.m_log != &local_108) {
      operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_d0 != local_c0) {
      operator_delete(local_d0,local_c0[0] + 1);
    }
  }
  deqp::gls::StateQueryUtil::verifyStateInteger
            (&local_78,&local_b0,0x825a,local_98.m_pipeline,this->m_verifierType);
  glu::ProgramPipeline::~ProgramPipeline(&local_98);
  tcu::TestLog::endSection((TestLog *)CONCAT44(local_f8.m_log._4_4_,(GLuint)local_f8.m_log));
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"AfterDelete","");
  local_138._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"After deleting","");
  tcu::ScopedLogSection::ScopedLogSection(&local_88,pTVar3,&local_158,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_f8.m_log._0_4_ = 0;
  glu::CallLogWrapper::glGenProgramPipelines(&local_b0,1,(GLuint *)&local_f8);
  glu::CallLogWrapper::glBindProgramPipeline(&local_b0,(GLuint)local_f8.m_log);
  glu::CallLogWrapper::glDeleteProgramPipelines(&local_b0,1,(GLuint *)&local_f8);
  GVar5 = glu::CallLogWrapper::glGetError(&local_b0);
  if (GVar5 == 0) goto LAB_01505d98;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Got Error ","");
  local_98.m_gl = (Functions *)glu::getErrorName;
  local_98.m_pipeline = GVar5;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_f0,&local_98);
  uVar8 = 0xf;
  if (local_d0 != local_c0) {
    uVar8 = local_c0[0];
  }
  if (uVar8 < local_f0._M_string_length + local_c8) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar9 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_f0._M_string_length + local_c8) goto LAB_01505c01;
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_d0);
  }
  else {
LAB_01505c01:
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)local_f0._M_dataplus._M_p);
  }
  local_118.m_log = &local_108;
  pTVar3 = (TestLog *)(plVar6 + 2);
  if ((TestLog *)*plVar6 == pTVar3) {
    local_108.m_log = pTVar3->m_log;
    lStack_100 = plVar6[3];
  }
  else {
    local_108.m_log = pTVar3->m_log;
    local_118.m_log = (TestLog *)*plVar6;
  }
  local_110 = plVar6[1];
  *plVar6 = (long)pTVar3;
  plVar6[1] = 0;
  *(undefined1 *)&pTVar3->m_log = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_138.field_2._M_allocated_capacity = *psVar7;
    local_138.field_2._8_8_ = plVar6[3];
    local_138._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar7;
    local_138._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_138._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_158.field_2._M_allocated_capacity = *psVar7;
    local_158.field_2._8_8_ = plVar6[3];
    local_158._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_158.field_2._M_allocated_capacity = *psVar7;
    local_158._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_158._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  tcu::ResultCollector::fail(&local_78,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (local_118.m_log != &local_108) {
    operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
LAB_01505d98:
  deqp::gls::StateQueryUtil::verifyStateInteger(&local_78,&local_b0,0x825a,0,this->m_verifierType);
  tcu::TestLog::endSection(local_88.m_log);
  tcu::ResultCollector::setTestContextResult
            (&local_78,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_message._M_dataplus._M_p != &local_78.m_message.field_2) {
    operator_delete(local_78.m_message._M_dataplus._M_p,
                    local_78.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_prefix._M_dataplus._M_p != &local_78.m_prefix.field_2) {
    operator_delete(local_78.m_prefix._M_dataplus._M_p,
                    local_78.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_b0);
  return STOP;
}

Assistant:

ProgramPipelineBindingCase::IterateResult ProgramPipelineBindingCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Initial", "Initial value");

		verifyStateInteger(result, gl, GL_PROGRAM_PIPELINE_BINDING, 0, m_verifierType);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "AfterBinding", "After binding");
		glu::ProgramPipeline		pipeline	(m_context.getRenderContext());

		gl.glBindProgramPipeline(pipeline.getPipeline());
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "setup");

		verifyStateInteger(result, gl, GL_PROGRAM_PIPELINE_BINDING, pipeline.getPipeline(), m_verifierType);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "AfterDelete", "After deleting");
		glw::GLuint					pipeline	= 0;

		gl.glGenProgramPipelines(1, &pipeline);
		gl.glBindProgramPipeline(pipeline);
		gl.glDeleteProgramPipelines(1, &pipeline);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "setup");

		verifyStateInteger(result, gl, GL_PROGRAM_PIPELINE_BINDING, 0, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}